

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c++
# Opt level: O1

void __thiscall
kj::MainBuilder::MainImpl::wrapText
          (MainImpl *this,Vector<char> *output,StringPtr indent,StringPtr text)

{
  RemoveConst<char> **ppRVar1;
  char *pcVar2;
  size_t __n;
  ulong uVar3;
  char *pcVar4;
  void *pvVar5;
  ulong uVar6;
  char *pcVar7;
  uint uVar8;
  char *pcVar9;
  ulong unaff_RBP;
  char *pcVar10;
  RemoveConst<char> *pRVar11;
  size_t newSize;
  size_t sVar12;
  uint uVar13;
  RemoveConst<char> *pRVar14;
  char *__s;
  size_t sVar15;
  bool bVar16;
  
  sVar12 = text.content.size_;
  __s = text.content.ptr;
  pcVar9 = indent.content.ptr;
  sVar15 = sVar12 - 1;
  if (sVar15 != 0) {
    uVar8 = 0x51 - (int)indent.content.size_;
    __n = indent.content.size_ - 1;
    uVar3 = (ulong)uVar8;
    do {
      pcVar2 = (output->builder).ptr;
      pcVar4 = (output->builder).pos + (__n - (long)pcVar2);
      pcVar7 = (output->builder).endPtr;
      pcVar10 = pcVar7 + -(long)pcVar2;
      if (pcVar10 < pcVar4) {
        pcVar10 = (char *)((long)pcVar10 * 2);
        if (pcVar7 == pcVar2) {
          pcVar10 = (char *)0x4;
        }
        if (pcVar10 < pcVar4) {
          pcVar10 = pcVar4;
        }
        Vector<char>::setCapacity(output,(size_t)pcVar10);
      }
      pRVar14 = (output->builder).pos;
      if (pcVar9 + (indent.content.size_ - 1) != pcVar9) {
        memcpy(pRVar14,pcVar9,__n);
        pRVar14 = pRVar14 + __n;
      }
      (output->builder).pos = pRVar14;
      pvVar5 = memchr(__s,10,sVar15);
      bVar16 = pvVar5 != (void *)0x0;
      if (bVar16) {
        unaff_RBP = (long)pvVar5 - (long)__s;
      }
      if (unaff_RBP <= uVar3 && bVar16) {
        pcVar2 = (output->builder).ptr;
        pcVar7 = (output->builder).endPtr;
        pRVar14 = pRVar14 + ((unaff_RBP + 1) - (long)pcVar2);
        pRVar11 = pcVar7 + -(long)pcVar2;
        if (pRVar11 < pRVar14) {
          pRVar11 = (RemoveConst<char> *)((long)pRVar11 * 2);
          if (pcVar7 == pcVar2) {
            pRVar11 = (RemoveConst<char> *)0x4;
          }
          if (pRVar11 < pRVar14) {
            pRVar11 = pRVar14;
          }
          Vector<char>::setCapacity(output,(size_t)pRVar11);
        }
        pRVar14 = (output->builder).pos;
        sVar15 = unaff_RBP + 1;
        if (sVar15 != 0) {
          memcpy(pRVar14,__s,sVar15);
          pRVar14 = pRVar14 + sVar15;
        }
        (output->builder).pos = pRVar14;
        __s = __s + unaff_RBP + 1;
        sVar12 = sVar12 - sVar15;
      }
      if (unaff_RBP > uVar3 || !bVar16) {
        uVar6 = sVar12 - 1;
        if (uVar6 <= uVar3) {
          pcVar9 = (output->builder).ptr;
          pcVar7 = (output->builder).pos + (sVar12 - (long)pcVar9) + -1;
          pcVar2 = (output->builder).endPtr;
          pcVar10 = pcVar2 + -(long)pcVar9;
          if (pcVar10 < pcVar7) {
            pcVar4 = (char *)0x4;
            if (pcVar2 != pcVar9) {
              pcVar4 = (char *)((long)pcVar10 * 2);
            }
            if (pcVar4 < pcVar7) {
              pcVar4 = pcVar7;
            }
            Vector<char>::setCapacity(output,(size_t)pcVar4);
          }
          pRVar14 = (output->builder).pos;
          if (__s != __s + (sVar12 - 1)) {
            memcpy(pRVar14,__s,uVar6);
            pRVar14 = pRVar14 + uVar6;
          }
          (output->builder).pos = pRVar14;
          pRVar11 = (output->builder).endPtr;
          if (pRVar14 == pRVar11) {
            pRVar14 = (output->builder).ptr;
            sVar12 = 4;
            if (pRVar11 != pRVar14) {
              sVar12 = ((long)pRVar11 - (long)pRVar14) * 2;
            }
            Vector<char>::setCapacity(output,sVar12);
          }
          *(output->builder).pos = '\n';
          ppRVar1 = &(output->builder).pos;
          *ppRVar1 = *ppRVar1 + 1;
          return;
        }
        sVar15 = (size_t)uVar8;
        uVar6 = uVar3;
        if ((int)indent.content.size_ != 0x51) {
          do {
            if ((__s[uVar6] == ' ') && (__s[uVar6 - 1] != ' ')) {
              sVar15 = uVar6 & 0xffffffff;
              goto LAB_00209b01;
            }
            uVar6 = uVar6 - 1;
          } while ((int)uVar6 != 0);
          sVar15 = (size_t)uVar8;
        }
LAB_00209b01:
        pcVar2 = (output->builder).ptr;
        pcVar4 = (output->builder).pos + (sVar15 - (long)pcVar2);
        pcVar7 = (output->builder).endPtr;
        pcVar10 = pcVar7 + -(long)pcVar2;
        if (pcVar10 < pcVar4) {
          pcVar10 = (char *)((long)pcVar10 * 2);
          if (pcVar7 == pcVar2) {
            pcVar10 = (char *)0x4;
          }
          if (pcVar10 < pcVar4) {
            pcVar10 = pcVar4;
          }
          Vector<char>::setCapacity(output,(size_t)pcVar10);
        }
        pRVar14 = (output->builder).pos;
        if ((int)sVar15 != 0) {
          memcpy(pRVar14,__s,sVar15);
          pRVar14 = pRVar14 + sVar15;
        }
        (output->builder).pos = pRVar14;
        pRVar11 = (output->builder).endPtr;
        if (pRVar14 == pRVar11) {
          pRVar14 = (output->builder).ptr;
          newSize = ((long)pRVar11 - (long)pRVar14) * 2;
          if (pRVar11 == pRVar14) {
            newSize = 4;
          }
          Vector<char>::setCapacity(output,newSize);
        }
        *(output->builder).pos = '\n';
        ppRVar1 = &(output->builder).pos;
        *ppRVar1 = *ppRVar1 + 1;
        do {
          pcVar2 = __s + sVar15;
          uVar13 = (int)sVar15 + 1;
          sVar15 = (size_t)uVar13;
        } while (*pcVar2 == ' ');
        uVar6 = (ulong)(((*pcVar2 == '\n') + uVar13) - 1);
        __s = __s + uVar6;
        sVar12 = sVar12 - uVar6;
      }
      sVar15 = sVar12 - 1;
    } while (sVar15 != 0);
  }
  return;
}

Assistant:

void MainBuilder::MainImpl::wrapText(Vector<char>& output, StringPtr indent, StringPtr text) {
  uint width = 80 - indent.size();

  while (text.size() > 0) {
    output.addAll(indent);

    KJ_IF_MAYBE(lineEnd, text.findFirst('\n')) {
      if (*lineEnd <= width) {
        output.addAll(text.slice(0, *lineEnd + 1));
        text = text.slice(*lineEnd + 1);
        continue;
      }
    }

    if (text.size() <= width) {
      output.addAll(text);
      output.add('\n');
      break;
    }

    uint wrapPos = width;
    for (;; wrapPos--) {
      if (wrapPos == 0) {
        // Hmm, no good place to break words.  Just break in the middle.
        wrapPos = width;
        break;
      } else if (text[wrapPos] == ' ' && text[wrapPos - 1] != ' ') {
        // This position is a space and is preceded by a non-space.  Wrap here.
        break;
      }
    }

    output.addAll(text.slice(0, wrapPos));
    output.add('\n');

    // Skip spaces after the text that was printed.
    while (text[wrapPos] == ' ') {
      ++wrapPos;
    }
    if (text[wrapPos] == '\n') {
      // Huh, apparently there were a whole bunch of spaces at the end of the line followed by a
      // newline.  Skip the newline as well so we don't print a blank line.
      ++wrapPos;
    }
    text = text.slice(wrapPos);
  }
}